

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool __thiscall
ctemplate::SectionTemplateNode::AddSubnode(SectionTemplateNode *this,Template *my_template)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ostream *poVar7;
  Template *my_template_00;
  long lVar8;
  TemplateToken token;
  char *local_a0;
  long local_98;
  char local_90 [16];
  TemplateToken local_80;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if (my_template->state_ == TS_ERROR) {
    return false;
  }
  if ((my_template->parse_state_).bufend <= (my_template->parse_state_).bufstart) {
    if ((this->token_).text == "__{{MAIN}}__") {
      return false;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
    pcVar2 = (my_template->resolved_filename_)._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x151350);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"File ended before all sections were closed",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    my_template->state_ = TS_ERROR;
    return false;
  }
  GetNextToken(&local_80,(SectionTemplateNode *)my_template,my_template);
  switch(local_80.type) {
  case TOKENTYPE_TEXT:
    bVar3 = AddTextNode(this,&local_80,my_template);
    iVar4 = std::__cxx11::string::compare((char *)&this->indentation_);
    pcVar2 = local_80.text + local_80.textlen;
    lVar5 = 0;
    do {
      lVar8 = lVar5;
      pcVar1 = pcVar2 + lVar8;
      if (pcVar1 <= local_80.text) break;
      lVar5 = lVar8 + -1;
    } while (pcVar2[lVar8 + -1] != '\n');
    if (((iVar4 == 0) || (-lVar8 != local_80.textlen)) && (lVar5 = lVar8, pcVar1 < pcVar2)) {
      do {
        if ((pcVar2[lVar5] != ' ') && (pcVar2[lVar5] != '\t')) goto LAB_0011b5cf;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0);
      if (pcVar2 <= pcVar1) goto LAB_0011b5cf;
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,pcVar1,(long)pcVar1 - lVar8);
    }
    else {
LAB_0011b5cf:
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = '\0';
    }
    std::__cxx11::string::operator=((string *)&this->indentation_,(string *)&local_a0);
    if (local_a0 != local_90) {
      operator_delete(local_a0);
    }
    goto LAB_0011b609;
  case TOKENTYPE_VARIABLE:
    bVar3 = AddVariableNode(this,&local_80,my_template);
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
LAB_0011b609:
    if (bVar3 != false) break;
    my_template->state_ = TS_ERROR;
  case TOKENTYPE_NULL:
switchD_0011af5f_caseD_9:
    bVar3 = false;
    goto LAB_0011b6b0;
  case TOKENTYPE_SECTION_START:
    AddSectionNode(this,&local_80,my_template,false);
    goto LAB_0011b450;
  case TOKENTYPE_SECTION_END:
    if ((local_80.textlen != (this->token_).textlen) ||
       (iVar4 = bcmp(local_80.text,(this->token_).text,local_80.textlen), iVar4 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               (my_template->resolved_filename_)._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Found end of different section than the one I am in",0x33);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nFound: ",8);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,local_80.text,local_80.text + local_80.textlen);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_a0,local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nIn: ",5);
      pcVar2 = (this->token_).text;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar2,pcVar2 + (this->token_).textlen);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_50,local_48);
      std::endl<char,std::char_traits<char>>(poVar7);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      my_template->state_ = TS_ERROR;
    }
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
    goto switchD_0011af5f_caseD_9;
  case TOKENTYPE_TEMPLATE:
    AddTemplateNode(this,&local_80,my_template,&this->indentation_);
    goto LAB_0011b450;
  case TOKENTYPE_COMMENT:
    break;
  case TOKENTYPE_SET_DELIMITERS:
    bVar3 = Template::ParseDelimiters
                      (local_80.text,local_80.textlen,
                       &(my_template->parse_state_).current_delimiters);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               (my_template->resolved_filename_)._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid delimiter-setting command.",0x22);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nFound: ",8);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,local_80.text,local_80.text + local_80.textlen);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_a0,local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nIn: ",5);
      pcVar2 = (this->token_).text;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar2,pcVar2 + (this->token_).textlen);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_50,local_48);
      std::endl<char,std::char_traits<char>>(poVar7);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_a0 != local_90) {
LAB_0011b5be:
        operator_delete(local_a0);
      }
LAB_0011b5c3:
      my_template->state_ = TS_ERROR;
    }
    break;
  case TOKENTYPE_PRAGMA:
    bVar3 = AddPragmaNode(this,&local_80,my_template_00);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               (my_template->resolved_filename_)._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Pragma marker must be at the top of the template: \'",0x33);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,local_80.text,local_80.text + local_80.textlen);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_a0,local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
      std::endl<char,std::char_traits<char>>(poVar7);
      if (local_a0 != local_90) goto LAB_0011b5be;
      goto LAB_0011b5c3;
    }
    break;
  case TOKENTYPE_HIDDEN_DEFAULT_SECTION:
    AddSectionNode(this,&local_80,my_template,true);
LAB_0011b450:
    (this->indentation_)._M_string_length = 0;
    *(this->indentation_)._M_dataplus._M_p = '\0';
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
    pcVar2 = (my_template->resolved_filename_)._M_dataplus._M_p;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x151350);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid token type returned from GetNextToken",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  bVar3 = true;
LAB_0011b6b0:
  if (local_80.modvals.
      super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.modvals.
                    super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool SectionTemplateNode::AddSubnode(Template *my_template) {
  bool auto_escape_success = true;
  // Don't proceed if we already found an error
  if (my_template->state() == TS_ERROR) {
    return false;
  }

  // Stop when the buffer is empty.
  if (my_template->parse_state_.bufstart >= my_template->parse_state_.bufend) {
    // running out of file contents ends the section too
    if (token_.text != kMainSectionName) {
      // if we are not in the main section, we have a syntax error in the file
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "File ended before all sections were closed" << endl;
      my_template->set_state(TS_ERROR);
    }
    return false;
  }

  TemplateToken token = GetNextToken(my_template);

  switch (token.type) {
    case TOKENTYPE_TEXT:
      auto_escape_success = this->AddTextNode(&token, my_template);
      // Store the indentation (trailing whitespace after a newline), if any.
      this->indentation_ = GetIndentation(token.text, token.textlen,
                                          indentation_ == "\n");
      break;
    case TOKENTYPE_VARIABLE:
      auto_escape_success = this->AddVariableNode(&token, my_template);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_START:
      auto_escape_success = this->AddSectionNode(&token, my_template, false);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_HIDDEN_DEFAULT_SECTION:
      auto_escape_success = this->AddSectionNode(&token, my_template, true);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_SECTION_END:
      // Don't add a node. Just make sure we are ending the right section
      // and return false to indicate the section is complete
      if (token.textlen != token_.textlen ||
          memcmp(token.text, token_.text, token.textlen)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Found end of different section than the one I am in"
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      return false;
      break;
    case TOKENTYPE_TEMPLATE:
      auto_escape_success = this->AddTemplateNode(&token, my_template,
                                                  this->indentation_);
      this->indentation_.clear();  // clear whenever last read wasn't whitespace
      break;
    case TOKENTYPE_COMMENT:
      // Do nothing. Comments just drop out of the file altogether.
      break;
    case TOKENTYPE_SET_DELIMITERS:
      if (!Template::ParseDelimiters(
              token.text, token.textlen,
              &my_template->parse_state_.current_delimiters)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Invalid delimiter-setting command."
                   << "\nFound: " << string(token.text, token.textlen)
                   << "\nIn: " << string(token_.text, token_.textlen) << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_PRAGMA:
      // We can do nothing and simply drop the pragma of the file as is done
      // for comments. But, there is value in keeping it for debug purposes
      // (via DumpToString) so add it as a pragma node.
      if (!this->AddPragmaNode(&token, my_template)) {
        LOG_TEMPLATE_NAME(ERROR, my_template);
        LOG(ERROR) << "Pragma marker must be at the top of the template: '"
                   << string(token.text, token.textlen) << "'" << endl;
        my_template->set_state(TS_ERROR);
      }
      break;
    case TOKENTYPE_NULL:
      // GetNextToken either hit the end of the file or a syntax error
      // in the file. Do nothing more here. Just return false to stop
      // processing.
      return false;
      break;
    default:
      // This shouldn't happen. If it does, it's a programmer error.
      LOG_TEMPLATE_NAME(ERROR, my_template);
      LOG(ERROR) << "Invalid token type returned from GetNextToken" << endl;
  }

  if (!auto_escape_success) {
    // The error is logged where it happens. Here indicate
    // the initialization failed.
    my_template->set_state(TS_ERROR);
    return false;
  }

  // for all the cases where we did not return false
  return true;
}